

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,QJsonObject *o)

{
  QCborMap QVar1;
  long in_FS_OFFSET;
  QCborMap local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCborMap::fromJsonObject(&local_20,o);
  QVar1.d.d.ptr = local_20.d.d.ptr;
  (this->value).n = -1;
  local_20.d.d.ptr =
       (QExplicitlySharedDataPointer<QCborContainerPrivate>)
       (totally_ordered_wrapper<QCborContainerPrivate_*>)0x0;
  (this->value).container = (QCborContainerPrivate *)QVar1.d.d.ptr;
  (this->value).t = Map;
  QCborMap::~QCborMap(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue::QJsonValue(const QJsonObject &o)
    : value(QCborMap::fromJsonObject(o))
{
}